

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lys_compile_augment_children
                 (lysc_ctx *ctx,lysp_when *aug_when,uint16_t aug_flags,lysp_node *child,
                 lysc_node *target,ly_bool child_unres_disabled)

{
  ushort uVar1;
  lysc_node *node;
  ly_ctx *ctx_00;
  LY_ERR LVar2;
  lysc_node *ctx_node;
  char *pcVar3;
  char *pcVar4;
  uint32_t uVar5;
  ulong uVar6;
  undefined7 in_register_00000089;
  ly_bool enabled;
  ly_set child_set;
  lysc_when *when_shared;
  ly_bool local_65;
  uint32_t local_64;
  uint local_60;
  undefined4 local_5c;
  ly_set local_58;
  undefined4 local_44;
  lysp_node *local_40;
  lysc_when *local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000089,child_unres_disabled);
  local_38 = (lysc_when *)0x0;
  local_58.size = 0;
  local_58.count = 0;
  local_58.field_2.dnodes = (lyd_node **)0x0;
  if (((aug_when != (lysp_when *)0x0) || (target->nodetype == 2)) ||
     (local_5c = (undefined4)CONCAT71((int7)((ulong)child >> 8),1), ctx->cur_mod == target->module))
  {
    local_5c = 0;
  }
  if (child == (lysp_node *)0x0) {
    LVar2 = LY_SUCCESS;
    uVar5 = ctx->compile_opts;
  }
  else {
    local_60 = (uint)aug_flags;
    local_64 = ctx->compile_opts;
    while ((((uVar5 = local_64, uVar1 = child->nodetype, uVar1 != 0x80 || (target->nodetype == 2))
            && (((uVar1 & 0x700) == 0 || ((target->nodetype & 0x11) != 0)))) &&
           ((uVar1 != 0x800 || (target->nodetype != 2))))) {
      uVar1 = target->nodetype;
      if (uVar1 == 2) {
        LVar2 = lys_compile_node_choice_child(ctx,child,target,&local_58);
      }
      else {
        if ((uVar1 & 0x3000) != 0) {
          ctx->compile_opts = ctx->compile_opts | (uint)(uVar1 != 0x1000) * 0x1000 + 0x1004;
        }
        LVar2 = lys_compile_node(ctx,child,target,(uint16_t)local_60,&local_58);
      }
      if ((LVar2 != LY_SUCCESS) ||
         (LVar2 = lys_eval_iffeatures(ctx->ctx,child->iffeatures,&local_65), LVar2 != LY_SUCCESS))
      goto LAB_0015549d;
      if ((local_65 == '\0') && ((ctx->compile_opts & 0xb) == 0)) {
        ctx->compile_opts = ctx->compile_opts | 2;
      }
      local_40 = child;
      if (local_58.count != 0) {
        uVar6 = 0;
        do {
          node = (lysc_node *)local_58.field_2.dnodes[uVar6];
          if (((char)local_5c != '\0') && ((~node->flags & 0x21) == 0)) {
            node->flags = node->flags & 0xffdf;
            lys_compile_mandatory_parents(target,'\0');
            ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                    "Invalid augment adding mandatory node \"%s\" without making it conditional via when statement."
                    ,node->name);
            LVar2 = LY_EVALID;
            uVar5 = local_64;
            goto LAB_0015549d;
          }
          if (aug_when != (lysp_when *)0x0) {
            ctx_node = lysc_data_node(target);
            LVar2 = lys_compile_when(ctx,aug_when,(uint16_t)local_60,target,ctx_node,node,&local_38)
            ;
            uVar5 = local_64;
            if (LVar2 != LY_SUCCESS) goto LAB_0015549d;
          }
          if ((char)local_44 != '\0') {
            ly_set_add(&ctx->unres->disabled,node,'\x01',(uint32_t *)0x0);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < (ulong)local_58._0_8_ >> 0x20);
      }
      LVar2 = LY_SUCCESS;
      ly_set_erase(&local_58,(_func_void_void_ptr *)0x0);
      ctx->compile_opts = local_64;
      child = local_40->next;
      uVar5 = local_64;
      if (child == (lysp_node *)0x0) goto LAB_0015549d;
    }
    ctx_00 = ctx->ctx;
    pcVar3 = lys_nodetype2str(target->nodetype);
    pcVar4 = lys_nodetype2str(child->nodetype);
    ly_vlog(ctx_00,(char *)0x0,LYVE_REFERENCE,
            "Invalid augment of %s node which is not allowed to contain %s node \"%s\".",pcVar3,
            pcVar4,child->name);
    LVar2 = LY_EVALID;
  }
LAB_0015549d:
  ly_set_erase(&local_58,(_func_void_void_ptr *)0x0);
  ctx->compile_opts = uVar5;
  return LVar2;
}

Assistant:

static LY_ERR
lys_compile_augment_children(struct lysc_ctx *ctx, struct lysp_when *aug_when, uint16_t aug_flags, struct lysp_node *child,
        struct lysc_node *target, ly_bool child_unres_disabled)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysp_node *pnode;
    struct lysc_node *node;
    struct lysc_when *when_shared = NULL;
    ly_bool enabled, allow_mand = 0;
    struct ly_set child_set = {0};
    uint32_t i, opt_prev = ctx->compile_opts;

    /* check for mandatory nodes
     * - new cases augmenting some choice can have mandatory nodes
     * - mandatory nodes are allowed only in case the augmentation is made conditional with a when statement
     */
    if (aug_when || (target->nodetype == LYS_CHOICE) || (ctx->cur_mod == target->module)) {
        allow_mand = 1;
    }

    LY_LIST_FOR(child, pnode) {
        /* check if the subnode can be connected to the found target (e.g. case cannot be inserted into container) */
        if (((pnode->nodetype == LYS_CASE) && (target->nodetype != LYS_CHOICE)) ||
                ((pnode->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)) && !(target->nodetype & (LYS_CONTAINER | LYS_LIST))) ||
                ((pnode->nodetype == LYS_USES) && (target->nodetype == LYS_CHOICE))) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE,
                    "Invalid augment of %s node which is not allowed to contain %s node \"%s\".",
                    lys_nodetype2str(target->nodetype), lys_nodetype2str(pnode->nodetype), pnode->name);
            rc = LY_EVALID;
            goto cleanup;
        }

        /* compile the children */
        if (target->nodetype == LYS_CHOICE) {
            LY_CHECK_GOTO(rc = lys_compile_node_choice_child(ctx, pnode, target, &child_set), cleanup);
        } else if (target->nodetype & (LYS_INPUT | LYS_OUTPUT)) {
            if (target->nodetype == LYS_INPUT) {
                ctx->compile_opts |= LYS_COMPILE_RPC_INPUT;
            } else {
                ctx->compile_opts |= LYS_COMPILE_RPC_OUTPUT;
            }
            LY_CHECK_GOTO(rc = lys_compile_node(ctx, pnode, target, aug_flags, &child_set), cleanup);
        } else {
            LY_CHECK_GOTO(rc = lys_compile_node(ctx, pnode, target, aug_flags, &child_set), cleanup);
        }

        /* eval if-features again for the rest of this node processing */
        LY_CHECK_GOTO(rc = lys_eval_iffeatures(ctx->ctx, pnode->iffeatures, &enabled), cleanup);
        if (!enabled && !(ctx->compile_opts & (LYS_COMPILE_NO_DISABLED | LYS_COMPILE_DISABLED | LYS_COMPILE_GROUPING))) {
            ctx->compile_opts |= LYS_COMPILE_DISABLED;
        }

        /* since the augment node is not present in the compiled tree, we need to pass some of its
         * statements to all its children */
        for (i = 0; i < child_set.count; ++i) {
            node = child_set.snodes[i];
            if (!allow_mand && (node->flags & LYS_CONFIG_W) && (node->flags & LYS_MAND_TRUE)) {
                node->flags &= ~LYS_MAND_TRUE;
                lys_compile_mandatory_parents(target, 0);
                LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                        "Invalid augment adding mandatory node \"%s\" without making it conditional via when statement.",
                        node->name);
                rc = LY_EVALID;
                goto cleanup;
            }

            if (aug_when) {
                /* pass augment's when to all the children */
                rc = lys_compile_when(ctx, aug_when, aug_flags, target, lysc_data_node(target), node, &when_shared);
                LY_CHECK_GOTO(rc, cleanup);
            }

            if (child_unres_disabled) {
                /* child is disabled by the augment if-features */
                ly_set_add(&ctx->unres->disabled, node, 1, NULL);
            }
        }

        /* next iter */
        ly_set_erase(&child_set, NULL);
        ctx->compile_opts = opt_prev;
    }

cleanup:
    ly_set_erase(&child_set, NULL);
    ctx->compile_opts = opt_prev;
    return rc;
}